

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

Vec_Wrd_t * Maj3_ManTruthTables(Maj3_Man_t *p)

{
  int iVar1;
  uint uVar2;
  word wVar3;
  bool bVar4;
  int iVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vec_Wrd_t *pVVar10;
  word *__s;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  int nWords;
  uint uVar18;
  ulong uVar19;
  word *pwVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar26;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  long lVar28;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  int iVar31;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  iVar12 = p->nWords;
  lVar21 = (long)iVar12;
  iVar1 = p->nObjs;
  lVar22 = ((long)iVar1 + 1) * lVar21;
  pVVar10 = (Vec_Wrd_t *)malloc(0x10);
  iVar5 = (int)lVar22;
  iVar11 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar11 = iVar5;
  }
  pVVar10->nCap = iVar11;
  if (iVar11 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar11 << 3);
  }
  pVVar10->pArray = __s;
  pVVar10->nSize = iVar5;
  uVar17 = 0;
  memset(__s,0,lVar22 * 8);
  p->vInfo = pVVar10;
  auVar9 = _DAT_0093d220;
  auVar8 = _DAT_0093d210;
  uVar2 = p->nVars;
  uVar18 = 1 << ((byte)uVar2 & 0x1f);
  uVar15 = 0x40;
  if (0x40 < (int)uVar18) {
    uVar15 = uVar18;
  }
  if (0 < (long)(int)uVar2) {
    uVar19 = (ulong)(uint)(1 << ((byte)uVar2 - 6 & 0x1f));
    if (uVar2 < 7) {
      uVar19 = 1;
    }
    iVar11 = (int)uVar19;
    lVar16 = uVar19 - 1;
    auVar24._8_4_ = (int)lVar16;
    auVar24._0_8_ = lVar16;
    auVar24._12_4_ = (int)((ulong)lVar16 >> 0x20);
    pwVar20 = __s + 1;
    uVar19 = 0;
    auVar24 = auVar24 ^ _DAT_0093d220;
    do {
      if (((long)(uVar19 * lVar21) < 0) || (lVar22 <= (long)(uVar19 * lVar21))) goto LAB_005acbd3;
      iVar23 = auVar24._0_4_;
      iVar26 = auVar24._4_4_;
      if (uVar19 < 6) {
        if (0 < iVar11) {
          wVar3 = s_Truths6[uVar19];
          lVar16 = 0;
          auVar30 = auVar8;
          do {
            auVar29 = auVar30 ^ auVar9;
            bVar4 = iVar23 < auVar29._0_4_;
            iVar31 = auVar29._4_4_;
            if ((bool)(~(iVar26 < iVar31 || iVar31 == iVar26 && bVar4) & 1)) {
              *(word *)((long)pwVar20 + lVar16 + -8) = wVar3;
            }
            if (iVar26 >= iVar31 && (iVar31 != iVar26 || !bVar4)) {
              *(word *)((long)pwVar20 + lVar16) = wVar3;
            }
            lVar28 = auVar30._8_8_;
            auVar30._0_8_ = auVar30._0_8_ + 2;
            auVar30._8_8_ = lVar28 + 2;
            lVar16 = lVar16 + 0x10;
          } while ((ulong)(iVar11 + 1U >> 1) << 4 != lVar16);
        }
      }
      else if (0 < iVar11) {
        uVar18 = 1 << ((char)uVar19 - 6U & 0x1f);
        uVar14 = 0;
        auVar29 = auVar8;
        do {
          auVar30 = auVar29 ^ auVar9;
          bVar4 = iVar23 < auVar30._0_4_;
          iVar31 = auVar30._4_4_;
          if ((bool)(~(iVar26 < iVar31 || iVar31 == iVar26 && bVar4) & 1)) {
            pwVar20[uVar14 - 1] = -(ulong)((uVar18 & (uint)uVar14) != 0);
          }
          if (iVar26 >= iVar31 && (iVar31 != iVar26 || !bVar4)) {
            pwVar20[uVar14] = -(ulong)(((uint)uVar14 + 1 & uVar18) != 0);
          }
          uVar14 = uVar14 + 2;
          lVar16 = auVar29._8_8_;
          auVar29._0_8_ = auVar29._0_8_ + 2;
          auVar29._8_8_ = lVar16 + 2;
        } while ((iVar11 + 1U & 0xfffffffe) != uVar14);
      }
      uVar19 = uVar19 + 1;
      pwVar20 = pwVar20 + lVar21;
    } while (uVar19 != (long)(int)uVar2);
  }
  auVar9 = _DAT_0094a000;
  auVar8 = _DAT_0093d220;
  uVar18 = iVar12 * iVar1;
  iVar12 = uVar2 - 1;
  auVar25._4_4_ = iVar12;
  auVar25._0_4_ = iVar12;
  auVar25._8_4_ = iVar12;
  auVar25._12_4_ = iVar12;
  auVar25 = auVar25 ^ _DAT_0093d220;
  do {
    if ((int)uVar2 < 1) {
      iVar12 = 0;
    }
    else {
      auVar32._4_4_ = uVar17;
      auVar32._0_4_ = uVar17;
      auVar32._8_4_ = uVar17;
      auVar32._12_4_ = uVar17;
      auVar35 = (undefined1  [16])0x0;
      auVar34 = auVar9;
      uVar13 = uVar2 + 3 & 0xfffffffc;
      do {
        auVar24 = auVar34;
        auVar29 = auVar35;
        auVar30 = pshuflw(auVar29,auVar24,0xfe);
        auVar34 = pshuflw(in_XMM11,auVar24,0x54);
        auVar33._0_8_ = auVar24._8_8_;
        auVar33._8_4_ = auVar24._8_4_;
        auVar33._12_4_ = auVar24._12_4_;
        auVar35 = pshuflw(auVar34,auVar33,0xfe);
        lVar21 = auVar35._0_8_;
        auVar6._4_8_ = auVar32._8_8_;
        auVar6._0_4_ = uVar17 >> lVar21;
        auVar37._0_8_ = auVar6._0_8_ << 0x20;
        auVar37._8_4_ = uVar17 >> lVar21;
        auVar37._12_4_ = uVar17 >> lVar21;
        auVar35 = pshuflw(auVar33,auVar33,0x54);
        lVar21 = auVar35._0_8_;
        auVar7._4_8_ = auVar32._8_8_;
        auVar7._0_4_ = uVar17 >> lVar21;
        auVar36._0_8_ = auVar7._0_8_ << 0x20;
        auVar36._8_4_ = uVar17 >> lVar21;
        auVar36._12_4_ = uVar17 >> lVar21;
        in_XMM11._8_8_ = auVar37._8_8_;
        in_XMM11._0_8_ = auVar36._8_8_;
        auVar35._0_4_ = (uVar17 >> auVar34._0_8_ & 1) + auVar29._0_4_;
        auVar35._4_4_ = (uVar17 >> auVar30._0_8_ & 1) + auVar29._4_4_;
        auVar35._8_4_ = (auVar36._8_4_ & 1) + auVar29._8_4_;
        auVar35._12_4_ = (auVar37._12_4_ & 1) + auVar29._12_4_;
        auVar34._0_4_ = auVar24._0_4_ + 4;
        auVar34._4_4_ = auVar24._4_4_ + 4;
        auVar34._8_4_ = auVar24._8_4_ + 4;
        auVar34._12_4_ = auVar24._12_4_ + 4;
        uVar13 = uVar13 - 4;
      } while (uVar13 != 0);
      auVar24 = auVar24 ^ auVar8;
      auVar27._0_4_ = -(uint)(auVar25._0_4_ < auVar24._0_4_);
      auVar27._4_4_ = -(uint)(auVar25._4_4_ < auVar24._4_4_);
      auVar27._8_4_ = -(uint)(auVar25._8_4_ < auVar24._8_4_);
      auVar27._12_4_ = -(uint)(auVar25._12_4_ < auVar24._12_4_);
      auVar24 = ~auVar27 & auVar35 | auVar29 & auVar27;
      iVar12 = auVar24._12_4_ + auVar24._4_4_ + auVar24._8_4_ + auVar24._0_4_;
    }
    if ((int)uVar2 / 2 < iVar12) {
      if (iVar5 <= (int)uVar18 || (int)uVar18 < 0) {
LAB_005acbd3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      __s[(ulong)uVar18 + (ulong)(uVar17 >> 6)] =
           __s[(ulong)uVar18 + (ulong)(uVar17 >> 6)] | 1L << ((byte)uVar17 & 0x3f);
    }
    uVar17 = uVar17 + 1;
    if (uVar17 == uVar15) {
      return pVVar10;
    }
  } while( true );
}

Assistant:

Vec_Wrd_t * Maj3_ManTruthTables( Maj3_Man_t * p )
{
    Vec_Wrd_t * vInfo = p->vInfo = Vec_WrdStart( p->nWords * (p->nObjs + 1) ); 
    int i, nMints = Abc_MaxInt( 64, 1 << p->nVars );
    for ( i = 0; i < p->nVars; i++ )
        Abc_TtIthVar( Maj3_ManTruth(p, i), i, p->nVars );
    for ( i = 0; i < nMints; i++ )
        if ( Maj3_ManValue(i, p->nVars) )
            Abc_TtSetBit( Maj3_ManTruth(p, p->nObjs), i );
    //Dau_DsdPrintFromTruth( Maj3_ManTruth(p, p->nObjs), p->nVars );
    return vInfo;
}